

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MemPool.cpp
# Opt level: O2

void amrex_mempool_init(void)

{
  long *plVar1;
  long *plVar2;
  bool bVar3;
  void *__s;
  pointer *__ptr;
  long lVar4;
  long *local_b8;
  undefined1 local_ac [4];
  string local_a8;
  ParmParse pp;
  
  if ((anonymous_namespace)::initialized == '\0') {
    (anonymous_namespace)::initialized = '\x01';
    std::__cxx11::string::string((string *)(local_ac + 4),"fab",(allocator *)&local_b8);
    amrex::ParmParse::ParmParse(&pp,(string *)(local_ac + 4));
    std::__cxx11::string::~string((string *)(local_ac + 4));
    amrex::ParmParse::queryAdd<int,_0>(&pp,"init_snan",&(anonymous_namespace)::init_snan);
    std::
    vector<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>,_std::allocator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_>_>
    ::resize((vector<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>,_std::allocator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_>_>
              *)&(anonymous_namespace)::the_memory_pool,1);
    bVar3 = true;
    lVar4 = 0;
    while (bVar3) {
      local_ac = (undefined1  [4])0x0;
      local_a8._M_dataplus._M_p = (pointer)0x7fffffffffffffff;
      local_a8._M_string_length = 1;
      std::make_unique<amrex::CArena,int,amrex::ArenaInfo&>((int *)&local_b8,(ArenaInfo *)local_ac);
      plVar2 = local_b8;
      local_b8 = (long *)0x0;
      plVar1 = *(long **)((anonymous_namespace)::the_memory_pool + lVar4 * 8);
      *(long **)((anonymous_namespace)::the_memory_pool + lVar4 * 8) = plVar2;
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
      if (local_b8 != (long *)0x0) {
        (**(code **)(*local_b8 + 8))();
      }
      bVar3 = false;
      lVar4 = 1;
    }
    __s = amrex_mempool_alloc(0x800000);
    memset(__s,0,0x800000);
    amrex_mempool_free(__s);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&pp);
  }
  return;
}

Assistant:

void amrex_mempool_init ()
{
    if (!initialized)
    {
        initialized = true;

        ParmParse pp("fab");
        pp.queryAdd("init_snan", init_snan);

        int nthreads = OpenMP::get_max_threads();

        the_memory_pool.resize(nthreads);
        for (int i=0; i<nthreads; ++i) {
            the_memory_pool[i] = std::make_unique<CArena>(0, ArenaInfo().SetCpuMemory());
        }

#ifdef AMREX_USE_OMP
#pragma omp parallel num_threads(nthreads)
#endif
        {
            size_t N = 1024*1024*sizeof(double);
            void *p = amrex_mempool_alloc(N);
            memset(p, 0, N);
            amrex_mempool_free(p);
        }

#ifdef AMREX_MEM_PROFILING
        MemProfiler::add("MemPool", std::function<MemProfiler::MemInfo()>
                         ([] () -> MemProfiler::MemInfo {
                             int MB_min, MB_max, MB_tot;
                             amrex_mempool_get_stats(MB_min, MB_max, MB_tot);
                             Long b = MB_tot * (1024L*1024L);
                             return {b, b};
                         }));
#endif
    }
}